

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O1

base_uint<256U> * __thiscall base_uint<256U>::operator-=(base_uint<256U> *this,base_uint<256U> *b)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  base_uint<256U> ret;
  base_uint<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_38);
  lVar3 = 0;
  do {
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    *(undefined1 (*) [16])(local_38.pn + lVar3) = *(undefined1 (*) [16])(b->pn + lVar3) ^ auVar2;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    puVar1 = local_38.pn + lVar3;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 != 0) break;
    bVar5 = lVar3 != 7;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = (ulong)local_38.pn[lVar3] + this->pn[lVar3] + uVar4;
    this->pn[lVar3] = (uint32_t)uVar4;
    uVar4 = uVar4 >> 0x20;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator-=(const base_uint& b)
    {
        *this += -b;
        return *this;
    }